

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O1

String * __thiscall
Rml::StringUtilities::ToUTF8_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,Character *characters,
          int num_characters)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (0 < (int)characters) {
    uVar5 = 0;
    bVar3 = false;
    do {
      uVar1 = *(uint *)(this + uVar5 * 4);
      bVar4 = bVar3;
      if (uVar1 < 0x80) {
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        bVar2 = (byte)uVar1;
        if (uVar1 < 0x800) {
          local_41 = (byte)(uVar1 >> 6) | 0xc0;
          local_40 = bVar2 & 0x3f | 0x80;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_41);
        }
        else if (uVar1 < 0x10000) {
          local_3f = (byte)(uVar1 >> 0xc) | 0xe0;
          local_3e = (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_3d = bVar2 & 0x3f | 0x80;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_3f);
        }
        else {
          bVar4 = true;
          if (uVar1 < 0x110000) {
            local_3c = (byte)(uVar1 >> 0x12) | 0xf0;
            local_3b = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
            local_3a = (byte)(uVar1 >> 6) & 0x3f | 0x80;
            local_39 = bVar2 & 0x3f | 0x80;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_3c);
            bVar4 = bVar3;
          }
        }
      }
      uVar5 = uVar5 + 1;
      bVar3 = bVar4;
    } while (((ulong)characters & 0xffffffff) != uVar5);
    if (bVar4) {
      Log::Message(LT_WARNING,"One or more invalid code points encountered while encoding to UTF-8."
                  );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::ToUTF8(const Character* characters, int num_characters)
{
	String result;
	result.reserve(num_characters);

	bool invalid_character = false;

	for (int i = 0; i < num_characters; i++)
	{
		char32_t c = (char32_t)characters[i];

		constexpr int l3 = 0b0000'0111;
		constexpr int l4 = 0b0000'1111;
		constexpr int l5 = 0b0001'1111;
		constexpr int l6 = 0b0011'1111;
		constexpr int h1 = 0b1000'0000;
		constexpr int h2 = 0b1100'0000;
		constexpr int h3 = 0b1110'0000;
		constexpr int h4 = 0b1111'0000;

		if (c < 0x80)
			result += (char)c;
		else if (c < 0x800)
			result += {char(((c >> 6) & l5) | h2), char((c & l6) | h1)};
		else if (c < 0x10000)
			result += {char(((c >> 12) & l4) | h3), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else if (c <= 0x10FFFF)
			result += {char(((c >> 18) & l3) | h4), char(((c >> 12) & l6) | h1), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else
			invalid_character = true;
	}

	if (invalid_character)
		Log::Message(Log::LT_WARNING, "One or more invalid code points encountered while encoding to UTF-8.");

	return result;
}